

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGet *curr)

{
  int32_t iVar1;
  Literal *this_00;
  undefined1 local_a0 [8];
  Flow index;
  TableInterfaceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_a0,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->index);
  if (index.breakTo.super_IString.str._M_len == 0) {
    getTableInterfaceInfo
              ((TableInterfaceInfo *)&index.breakTo.super_IString.str._M_str,this,
               (Name)(curr->table).super_IString.str);
    this_00 = Flow::getSingleValue((Flow *)local_a0);
    iVar1 = Literal::geti32(this_00);
    (**(code **)(*(long *)index.breakTo.super_IString.str._M_str + 0xe8))
              (&info.name.super_IString.str._M_str,index.breakTo.super_IString.str._M_str,
               info.interface,info.name.super_IString.str._M_len,iVar1);
    Flow::Flow(__return_storage_ptr__,(Literal *)&info.name.super_IString.str._M_str);
    Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGet(TableGet* curr) {
    NOTE_ENTER("TableGet");
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    auto info = getTableInterfaceInfo(curr->table);
    return info.interface->tableLoad(info.name,
                                     index.getSingleValue().geti32());
  }